

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::write_str<char>(basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *this,basic_string_view<char> s,format_specs *spec)

{
  ulong uVar1;
  ulong size;
  ulong uVar2;
  
  size = s.size_;
  uVar1 = (ulong)spec->precision_;
  uVar2 = size;
  if (uVar1 < size) {
    uVar2 = uVar1;
  }
  if (-1 < (long)uVar1) {
    size = uVar2;
  }
  write_str<char>(this,s.data_,size,&spec->super_align_spec);
  return;
}

Assistant:

void basic_writer<Range>::write_str(
    basic_string_view<Char> s, const format_specs &spec) {
  const Char *data = s.data();
  std::size_t size = s.size();
  std::size_t precision = static_cast<std::size_t>(spec.precision_);
  if (spec.precision_ >= 0 && precision < size)
    size = precision;
  write_str(data, size, spec);
}